

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# native.c
# Opt level: O1

Object * handle_native(Object *__return_storage_ptr__,Call c,Environment *env)

{
  undefined8 *puVar1;
  int iVar2;
  code *pcVar3;
  long lVar4;
  void *pvVar5;
  undefined8 uVar6;
  Library *pLVar7;
  char *in_RCX;
  Environment *env_00;
  long lVar8;
  ulong uVar9;
  long lVar10;
  char *pcVar11;
  
  iVar2 = strcmp(c.identifer,"LoadLibrary");
  if (iVar2 == 0) {
    load_library(__return_storage_ptr__,c.line,env,(char *)0x0);
  }
  else {
    iVar2 = strcmp(c.identifer,"UnloadLibrary");
    if (iVar2 == 0) {
      pcVar11 = get_string("x",c.line,env);
      iVar2 = hasLib(pcVar11);
      pLVar7 = libraries;
      if (iVar2 == 0) {
        printf("\x1b[33m\n[Warning] Library \'%s\' is not loaded!\x1b[0m",pcVar11);
      }
      else {
        uVar9 = (ulong)(uint)libCount;
        if (uVar9 == 1) {
          unload_all();
          *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x28) = 0;
          *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x30) = 0;
          (__return_storage_ptr__->field_1).routine.arguments = (char **)0;
          *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0;
          (__return_storage_ptr__->field_1).literal.field_2 =
               (anon_union_8_4_50a03f35_for_Literal_2)0;
          *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0;
          __return_storage_ptr__->type = OBJECT_NULL;
          *(undefined4 *)&__return_storage_ptr__->field_0x4 = 0;
          (__return_storage_ptr__->field_1).instance = (Instance *)0x400000000;
          return __return_storage_ptr__;
        }
        if (0 < libCount) {
          lVar8 = 0;
          do {
            iVar2 = strcmp(*(char **)((long)&pLVar7->name + lVar8),pcVar11);
            if (iVar2 == 0) {
              dlclose(*(undefined8 *)((long)&pLVar7->handle + lVar8));
              lVar10 = dlerror();
              if (lVar10 != 0) {
                printf("\x1b[33m\n[Warning] %s\x1b[0m",lVar10);
              }
              pLVar7 = libraries;
              lVar10 = (long)libCount;
              *(char **)((long)&libraries->name + lVar8) = libraries[lVar10 + -1].name;
              *(void **)((long)&pLVar7->handle + lVar8) = pLVar7[lVar10 + -1].handle;
              break;
            }
            lVar8 = lVar8 + 0x10;
          } while (uVar9 << 4 != lVar8);
        }
        lVar8 = (long)libCount;
        libCount = (int)(lVar8 + -1);
        libraries = (Library *)realloc(libraries,(lVar8 + -1) * 0x10);
      }
      __return_storage_ptr__->type = OBJECT_NULL;
      *(undefined4 *)&__return_storage_ptr__->field_0x4 = 0;
      (__return_storage_ptr__->field_1).instance = (Instance *)0x400000000;
      (__return_storage_ptr__->field_1).literal.field_2 = (anon_union_8_4_50a03f35_for_Literal_2)0;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0;
      (__return_storage_ptr__->field_1).routine.arguments = (char **)0;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x28) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x30) = 0;
    }
    else {
      if (libCount == 0) {
        printf("\x1b[31m\n[Runtime Error] [Line:%d] Unable to call %s : No libraries loaded!\x1b[0m"
               ,(ulong)(uint)c.line,c.identifer);
        stop();
      }
      lVar8 = 8;
      lVar10 = -1;
      do {
        lVar10 = lVar10 + 1;
        if (libCount <= lVar10) {
          pcVar11 = 
          "\x1b[31m\n[Runtime Error] [Line:%d] Foreign routine \'%s\' not found in loaded libraries!\x1b[0m"
          ;
          uVar9 = (ulong)(uint)c.line;
          printf("\x1b[31m\n[Runtime Error] [Line:%d] Foreign routine \'%s\' not found in loaded libraries!\x1b[0m"
                 ,uVar9,c.identifer);
          stop();
          if (env_00 != (Environment *)0x0) {
            in_RCX = get_string("x",(int)uVar9,env_00);
          }
          iVar2 = hasLib(in_RCX);
          if (iVar2 == 0) {
            pvVar5 = (void *)dlopen(in_RCX,1);
            if (pvVar5 == (void *)0x0) {
              uVar6 = dlerror();
              printf("\x1b[31m\n[Runtime Error] [Line:%d] %s\x1b[0m",uVar9 & 0xffffffff,uVar6);
              stop();
            }
            lVar8 = (long)libCount;
            libCount = (int)(lVar8 + 1);
            pLVar7 = (Library *)realloc(libraries,(lVar8 + 1) * 0x10);
            libraries = pLVar7;
            pLVar7[lVar8].name = in_RCX;
            pLVar7[lVar8].handle = pvVar5;
          }
          *(undefined8 *)((long)&((Object *)pcVar11)->field_1 + 0x28) = 0;
          *(undefined8 *)((long)&((Object *)pcVar11)->field_1 + 0x30) = 0;
          (((Object *)pcVar11)->field_1).routine.arguments = (char **)0;
          *(undefined8 *)((long)&((Object *)pcVar11)->field_1 + 0x20) = 0;
          (((Object *)pcVar11)->field_1).literal.field_2 = (anon_union_8_4_50a03f35_for_Literal_2)0;
          *(undefined8 *)((long)&((Object *)pcVar11)->field_1 + 0x10) = 0;
          ((Object *)pcVar11)->type = OBJECT_NULL;
          *(undefined4 *)&((Object *)pcVar11)->field_0x4 = 0;
          (((Object *)pcVar11)->field_1).instance = (Instance *)0x400000000;
          return (Object *)pcVar11;
        }
        puVar1 = (undefined8 *)((long)&libraries->name + lVar8);
        lVar8 = lVar8 + 0x10;
        pcVar3 = (code *)dlsym(*puVar1,c.identifer);
        lVar4 = dlerror();
      } while (lVar4 != 0);
      (*pcVar3)(__return_storage_ptr__,c.line,env);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Object handle_native(Call c, Environment *env){
    char *fname = c.identifer;
    int i = 0;
    if(strcmp(fname, "LoadLibrary") == 0)
        return load_library(c.line, env, NULL);
    else if(strcmp(fname, "UnloadLibrary") == 0)
        return unload_library(c.line, env);
    else
        return run_native(c, env);
}